

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder(RTCPCompoundPacketBuilder *this)

{
  RTCPCompoundPacketBuilder *this_local;
  
  ~RTCPCompoundPacketBuilder(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

RTCPCompoundPacketBuilder::~RTCPCompoundPacketBuilder()
{
	if (external)
		compoundpacket = 0; // make sure RTCPCompoundPacket doesn't delete the external buffer
	ClearBuildBuffers();
}